

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<std::__cxx11::list<int,std::allocator<int>>>::
resolve<QtPromisePrivate::PromiseValue<std::__cxx11::list<int,std::allocator<int>>>const&>
          (PromiseResolver<std::__cxx11::list<int,std::allocator<int>>> *this,
          PromiseValue<std::__cxx11::list<int,_std::allocator<int>_>_> *value)

{
  QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *pQVar1;
  Data *pDVar2;
  PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_> *pPVar3;
  QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *promise;
  PromiseValue<std::__cxx11::list<int,_std::allocator<int>_>_> *value_local;
  PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_>::Data>
           ::operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_>::Data>
                         *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<std::__cxx11::list<int,_std::allocator<int>_>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::operator->(&(pQVar1->
                           super_QPromiseBase<std::__cxx11::list<int,_std::allocator<int>_>_>).m_d);
    PromiseData<std::__cxx11::list<int,std::allocator<int>>>::
    resolve<QtPromisePrivate::PromiseValue<std::__cxx11::list<int,std::allocator<int>>>const&>
              ((PromiseData<std::__cxx11::list<int,std::allocator<int>>> *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ::operator->(&(pQVar1->
                           super_QPromiseBase<std::__cxx11::list<int,_std::allocator<int>_>_>).m_d);
    PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
    ::dispatch(&pPVar3->
                super_PromiseDataBase<std::__cxx11::list<int,_std::allocator<int>_>,_void_(const_std::__cxx11::list<int,_std::allocator<int>_>_&)>
              );
    PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_>::release
              ((PromiseResolver<std::__cxx11::list<int,_std::allocator<int>_>_> *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }